

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O0

void __thiscall Kernel::Signature::~Signature(Signature *this)

{
  size_t sVar1;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  Symbol *in_stack_ffffffffffffffb0;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  sVar1 = Lib::Stack<Kernel::Signature::Symbol_*>::length
                    ((Stack<Kernel::Signature::Symbol_*> *)(in_RDI + 0x58));
  local_c = (int)sVar1;
  while (local_c = local_c + -1, -1 < local_c) {
    Lib::Stack<Kernel::Signature::Symbol_*>::operator[]
              ((Stack<Kernel::Signature::Symbol_*> *)(in_RDI + 0x58),(long)local_c);
    Symbol::destroyFnSymbol(in_stack_ffffffffffffffb0);
  }
  sVar1 = Lib::Stack<Kernel::Signature::Symbol_*>::length
                    ((Stack<Kernel::Signature::Symbol_*> *)(in_RDI + 0x78));
  local_10 = (int)sVar1;
  while (local_10 = local_10 + -1, -1 < local_10) {
    Lib::Stack<Kernel::Signature::Symbol_*>::operator[]
              ((Stack<Kernel::Signature::Symbol_*> *)(in_RDI + 0x78),(long)local_10);
    Symbol::destroyPredSymbol(in_stack_ffffffffffffffb0);
  }
  sVar1 = Lib::Stack<Kernel::Signature::Symbol_*>::length
                    ((Stack<Kernel::Signature::Symbol_*> *)(in_RDI + 0x98));
  local_14 = (int)sVar1;
  while (local_14 = local_14 + -1, -1 < local_14) {
    in_stack_ffffffffffffffb0 =
         (Symbol *)
         Lib::Stack<Kernel::Signature::Symbol_*>::operator[]
                   ((Stack<Kernel::Signature::Symbol_*> *)(in_RDI + 0x98),(long)local_14);
    Symbol::destroyTypeConSymbol(in_stack_ffffffffffffffb0);
  }
  Lib::DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             in_stack_ffffffffffffffb0);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             in_stack_ffffffffffffffb0);
  Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet
            ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x973ae6);
  Lib::
  DHMap<std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_stack_ffffffffffffffb0);
  Lib::Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_>::~Stack
            ((Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_> *)in_stack_ffffffffffffffb0);
  Lib::Stack<Kernel::Unit_*>::~Stack((Stack<Kernel::Unit_*> *)in_stack_ffffffffffffffb0);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
          *)0x973b2a);
  Lib::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_Lib::DefaultHash>
          *)0x973b3b);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
          *)0x973b4c);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
          *)0x973b5d);
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::~Map((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
          *)0x973b6e);
  Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet
            ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x973b7f);
  Lib::Stack<Kernel::Signature::Symbol_*>::~Stack
            ((Stack<Kernel::Signature::Symbol_*> *)in_stack_ffffffffffffffb0);
  Lib::Stack<Kernel::Signature::Symbol_*>::~Stack
            ((Stack<Kernel::Signature::Symbol_*> *)in_stack_ffffffffffffffb0);
  Lib::Stack<Kernel::Signature::Symbol_*>::~Stack
            ((Stack<Kernel::Signature::Symbol_*> *)in_stack_ffffffffffffffb0);
  Lib::DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             in_stack_ffffffffffffffb0);
  Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

Signature::~Signature ()
{
  for (int i = _funs.length()-1;i >= 0;i--) {
    _funs[i]->destroyFnSymbol();
  }
  for (int i = _preds.length()-1;i >= 0;i--) {
    _preds[i]->destroyPredSymbol();
  }
  for (int i = _typeCons.length()-1;i >= 0;i--) {
    _typeCons[i]->destroyTypeConSymbol();
  }
}